

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void cfd::core::ConvertFromUniValue<unsigned_int>(uint *value,UniValue *json_value)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  reference pcVar4;
  CfdException *this;
  string *psVar5;
  undefined8 uVar6;
  UniValue *in_RSI;
  undefined4 *in_RDI;
  uint64_t maximum;
  uint64_t unsigned_num;
  int64_t num;
  bool is_digits_only;
  iterator begin_pos;
  string str;
  UniValue json_value_copy;
  UniValue *in_stack_fffffffffffffd88;
  UniValue *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffda0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffda8;
  allocator *paVar7;
  CfdError error_code;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  VType initialType;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  allocator local_221;
  string local_220 [32];
  CfdSourceLocation local_200;
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [32];
  char *local_1c0;
  undefined4 local_1b8;
  char *local_1b0;
  CfdException *local_1a8;
  CfdException *local_1a0;
  CfdException *local_198;
  UniValue local_190;
  undefined8 local_138;
  char *local_130;
  undefined1 local_121;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  allocator local_111;
  string local_110 [32];
  UniValue local_f0;
  string local_88 [32];
  UniValue local_68;
  UniValue *local_10;
  undefined4 *local_8;
  
  initialType = (VType)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  UniValue::UniValue((UniValue *)in_stack_fffffffffffffdb0._M_current,
                     (UniValue *)in_stack_fffffffffffffda8._M_current);
  bVar1 = UniValue::isStr(&local_68);
  if (bVar1) {
    psVar5 = UniValue::get_str_abi_cxx11_(local_10);
    ::std::__cxx11::string::string(local_88,(string *)psVar5);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_110,"0",&local_111);
      UniValue::UniValue((UniValue *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                         initialType,(string *)in_stack_fffffffffffffdb0._M_current);
      UniValue::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      UniValue::~UniValue(&local_f0);
      ::std::__cxx11::string::~string(local_110);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
    else {
      local_120._M_current = (char *)::std::__cxx11::string::begin();
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_120);
      if (*pcVar4 == '-') {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_120);
      }
      local_130 = local_120._M_current;
      local_138 = ::std::__cxx11::string::end();
      uVar2 = ::std::all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                        (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                         (_func_int_int *)in_stack_fffffffffffffda0);
      local_121 = uVar2;
      if ((bool)uVar2) {
        psVar5 = UniValue::get_str_abi_cxx11_(local_10);
        UniValue::UniValue((UniValue *)CONCAT17(uVar2,in_stack_fffffffffffffdc0),
                           (VType)((ulong)psVar5 >> 0x20),
                           (string *)in_stack_fffffffffffffdb0._M_current);
        UniValue::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        UniValue::~UniValue(&local_190);
      }
    }
    ::std::__cxx11::string::~string(local_88);
  }
  error_code = (CfdError)((ulong)in_stack_fffffffffffffda8._M_current >> 0x20);
  bVar1 = UniValue::isNum(&local_68);
  if (bVar1) {
    this = (CfdException *)UniValue::get_int64(&local_68);
    local_1a0 = this;
    local_198 = this;
    uVar3 = ::std::numeric_limits<unsigned_int>::max();
    local_1a8 = (CfdException *)(ulong)uVar3;
    if ((-1 < (long)local_198) && (local_1a0 <= local_1a8)) {
      *local_8 = (int)local_198;
      UniValue::~UniValue(&local_68);
      return;
    }
    local_1c0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/../include/cfdcore/cfdcore_json_mapping_base.h"
                        ,0x2f);
    local_1c0 = local_1c0 + 1;
    local_1b8 = 0xef;
    local_1b0 = "ConvertFromUniValue";
    logger::warn<long_const&>
              ((CfdSourceLocation *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
               (long *)0x6c6519);
    local_1e2 = 1;
    psVar5 = (string *)__cxa_allocate_exception(0x30);
    paVar7 = &local_1e1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1e0,"Json value convert error. Value out of range.",paVar7)
    ;
    CfdException::CfdException(this,(CfdError)((ulong)paVar7 >> 0x20),psVar5);
    local_1e2 = 0;
    __cxa_throw(psVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_200.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/../include/cfdcore/cfdcore_json_mapping_base.h"
               ,0x2f);
  local_200.filename = local_200.filename + 1;
  local_200.line = 0x100;
  local_200.funcname = "ConvertFromUniValue";
  logger::warn<>(&local_200,"Invalid json format.");
  uVar6 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_220,"Json value convert error. Invalid json format.",&local_221);
  CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffffdb0._M_current,error_code,
             in_stack_fffffffffffffda0);
  __cxa_throw(uVar6,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

inline void ConvertFromUniValue(
    T& value, const UniValue& json_value) {  // NOLINT
  using cfd::core::CfdError;
  using cfd::core::CfdException;
  using cfd::core::logger::warn;
  UniValue json_value_copy = json_value;
  if (json_value_copy.isStr()) {
    auto str = json_value.get_str();
    if (str == "0n") {
      json_value_copy = UniValue(UniValue::VNUM, "0");
    } else {
      auto begin_pos = str.begin();
      if (*begin_pos == '-') ++begin_pos;
      bool is_digits_only = std::all_of(begin_pos, str.end(), ::isdigit);
      // check max of int64 : execute call get_int64()
      if (is_digits_only) {
        json_value_copy = UniValue(UniValue::VNUM, json_value.get_str());
      }
    }
  }

  if (json_value_copy.isNum()) {
    const int64_t num = json_value_copy.get_int64();
    if (std::is_unsigned<T>::value) {
      uint64_t unsigned_num = static_cast<uint64_t>(num);
      uint64_t maximum = static_cast<uint64_t>(std::numeric_limits<T>::max());
      if ((num < 0) || (maximum < unsigned_num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    } else {
      int64_t maximum = static_cast<int64_t>(std::numeric_limits<T>::max());
      int64_t minimum = static_cast<int64_t>(std::numeric_limits<T>::min());
      if ((maximum < num) || (minimum > num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    }
    value = static_cast<T>(num);
  } else {
    warn(CFD_LOG_SOURCE, "Invalid json format.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Json value convert error. Invalid json format.");
  }
}